

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O3

void re2::RE2PartialMatch(void)

{
  bool bVar1;
  StringPiece local_1a8;
  LogMessage local_198;
  
  RE2::RE2((RE2 *)&local_198,"x");
  local_1a8.ptr_ = "x";
  local_1a8.length_ = 1;
  bVar1 = RE2::PartialMatchN(&local_1a8,(RE2 *)&local_198,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_198);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x249,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.str_,"Check failed: RE2::PartialMatch(\"x\", \"x\")",0x29);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  RE2::RE2((RE2 *)&local_198,"h.*o");
  local_1a8.ptr_ = "hello";
  local_1a8.length_ = 5;
  bVar1 = RE2::PartialMatchN(&local_1a8,(RE2 *)&local_198,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_198);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x24a,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.str_,"Check failed: RE2::PartialMatch(\"hello\", \"h.*o\")",
               0x30);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  RE2::RE2((RE2 *)&local_198,"h.*o");
  local_1a8.ptr_ = "othello";
  local_1a8.length_ = 7;
  bVar1 = RE2::PartialMatchN(&local_1a8,(RE2 *)&local_198,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_198);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x24b,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.str_,"Check failed: RE2::PartialMatch(\"othello\", \"h.*o\")",
               0x32);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  RE2::RE2((RE2 *)&local_198,"h.*o");
  local_1a8.ptr_ = "hello!";
  local_1a8.length_ = 6;
  bVar1 = RE2::PartialMatchN(&local_1a8,(RE2 *)&local_198,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_198);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x24c,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.str_,"Check failed: RE2::PartialMatch(\"hello!\", \"h.*o\")",
               0x31);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  RE2::RE2((RE2 *)&local_198,"((((((((((((((((((((x))))))))))))))))))))");
  local_1a8.ptr_ = "x";
  local_1a8.length_ = 1;
  bVar1 = RE2::PartialMatchN(&local_1a8,(RE2 *)&local_198,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_198);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x24d,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198.str_,
               "Check failed: RE2::PartialMatch(\"x\", \"((((((((((((((((((((x))))))))))))))))))))\")"
               ,0x51);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_198);
  }
  return;
}

Assistant:

TEST(RE2, PartialMatch) {
  CHECK(RE2::PartialMatch("x", "x"));
  CHECK(RE2::PartialMatch("hello", "h.*o"));
  CHECK(RE2::PartialMatch("othello", "h.*o"));
  CHECK(RE2::PartialMatch("hello!", "h.*o"));
  CHECK(RE2::PartialMatch("x", "((((((((((((((((((((x))))))))))))))))))))"));
}